

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::IdentityGeometryShaderCase::init
          (IdentityGeometryShaderCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  bool bVar1;
  ContextType ctxType;
  int iVar2;
  deUint32 err;
  int extraout_EAX;
  RenderTarget *pRVar3;
  undefined4 extraout_var;
  NotSupportedError *pNVar5;
  int local_248 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_1a0 [384];
  long lVar4;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar1) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_IdentityShaderCase).super_TestCase.m_context)->m_contextInfo,
                       "GL_EXT_tessellation_shader");
    if (bVar1) {
      bVar1 = glu::ContextInfo::isExtensionSupported
                        (((this->super_IdentityShaderCase).super_TestCase.m_context)->m_contextInfo,
                         "GL_EXT_geometry_shader");
      if (bVar1) goto LAB_0131610e;
    }
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a0,
               "Test requires GL_EXT_tessellation_shader and GL_EXT_geometry_shader extensions",
               (allocator<char> *)&local_240);
    tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)local_1a0);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
LAB_0131610e:
  pRVar3 = Context::getRenderTarget((this->super_IdentityShaderCase).super_TestCase.m_context);
  if (0x7f < pRVar3->m_width) {
    pRVar3 = Context::getRenderTarget((this->super_IdentityShaderCase).super_TestCase.m_context);
    if (0x7f < pRVar3->m_height) {
      local_1a0._0_8_ =
           ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
      this_00 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,
                      "Testing tessellating shader program output does not change when a passthrough geometry shader is attached.\n"
                     );
      std::operator<<((ostream *)this_00,
                      "Rendering two images, first with and second without a geometry shader. Expecting similar results.\n"
                     );
      std::operator<<((ostream *)this_00,"Using additive blending to detect overlap.\n");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      if (Functional::(anonymous_namespace)::IdentityGeometryShaderCase::init()::patchBufferData ==
          '\0') {
        iVar2 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::IdentityGeometryShaderCase::
                                     init()::patchBufferData);
        if (iVar2 != 0) {
          init::patchBufferData[0].m_data[0] = _DAT_018c4310;
          init::patchBufferData[0].m_data[1] = _UNK_018c4314;
          init::patchBufferData[0].m_data[2] = _UNK_018c4318;
          init::patchBufferData[0].m_data[3] = _UNK_018c431c;
          init::patchBufferData[1].m_data[0] = _DAT_018c4320;
          init::patchBufferData[1].m_data[1] = _UNK_018c4324;
          init::patchBufferData[1].m_data[2] = _UNK_018c4328;
          init::patchBufferData[1].m_data[3] = _UNK_018c432c;
          init::patchBufferData[2].m_data[0] = _DAT_018c4330;
          init::patchBufferData[2].m_data[1] = _UNK_018c4334;
          init::patchBufferData[2].m_data[2] = _UNK_018c4338;
          init::patchBufferData[2].m_data[3] = _UNK_018c433c;
          init::patchBufferData[3].m_data[0] = (float)s_fff_fff__018c4340._0_4_;
          init::patchBufferData[3].m_data[1] = (float)s_fff_fff__018c4340._4_4_;
          init::patchBufferData[3].m_data[2] = ram0x018c4348;
          init::patchBufferData[3].m_data[3] = _UNK_018c434c;
          __cxa_guard_release(&Functional::(anonymous_namespace)::IdentityGeometryShaderCase::init()
                               ::patchBufferData);
        }
      }
      iVar2 = (*((this->super_IdentityShaderCase).super_TestCase.m_context)->m_renderCtx->
                _vptr_RenderContext[3])();
      lVar4 = CONCAT44(extraout_var,iVar2);
      (**(code **)(lVar4 + 0x6c8))(1,&this->m_patchBuffer);
      (**(code **)(lVar4 + 0x40))(0x8892,this->m_patchBuffer);
      (**(code **)(lVar4 + 0x150))(0x8892,0x40,init::patchBufferData,0x88e4);
      err = (**(code **)(lVar4 + 0x800))();
      glu::checkError(err,"gen buffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                      ,0xd3);
      return extraout_EAX;
    }
  }
  pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_248[1] = 0x80;
  de::toString<int>(&local_200,local_248 + 1);
  std::operator+(&local_1e0,"Test requires ",&local_200);
  std::operator+(&local_1c0,&local_1e0,"x");
  local_248[0] = 0x80;
  de::toString<int>(&local_220,local_248);
  std::operator+(&local_240,&local_1c0,&local_220);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                 &local_240," or larger render target.");
  tcu::NotSupportedError::NotSupportedError(pNVar5,(string *)local_1a0);
  __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void IdentityGeometryShaderCase::init (void)
{
	// Requirements
	const bool supportsES32		= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 &&
		(!m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader") ||
		 !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader")))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader and GL_EXT_geometry_shader extensions");

	if (m_context.getRenderTarget().getWidth() < RENDER_SIZE ||
		m_context.getRenderTarget().getHeight() < RENDER_SIZE)
		throw tcu::NotSupportedError("Test requires " + de::toString<int>(RENDER_SIZE) + "x" + de::toString<int>(RENDER_SIZE) + " or larger render target.");

	// Log

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing tessellating shader program output does not change when a passthrough geometry shader is attached.\n"
		<< "Rendering two images, first with and second without a geometry shader. Expecting similar results.\n"
		<< "Using additive blending to detect overlap.\n"
		<< tcu::TestLog::EndMessage;

	// Resources

	{
		static const tcu::Vec4 patchBufferData[4] =
		{
			tcu::Vec4( -0.9f, -0.9f, 0.0f, 1.0f ),
			tcu::Vec4( -0.9f,  0.9f, 0.0f, 1.0f ),
			tcu::Vec4(  0.9f, -0.9f, 0.0f, 1.0f ),
			tcu::Vec4(  0.9f,  0.9f, 0.0f, 1.0f ),
		};

		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.genBuffers(1, &m_patchBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_patchBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(patchBufferData), patchBufferData, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen buffer");
	}
}